

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

int check_response_cache(CManager_conflict cm,stone_type stone,action_class stage,event_item *event)

{
  int iVar1;
  int iVar2;
  FFSTypeHandle p_Var3;
  long lVar4;
  undefined4 in_register_00000014;
  int iVar5;
  CMincoming_format_list p_Var6;
  
  iVar5 = (int)stone;
  if (0 < (long)cm->in_format_count) {
    p_Var6 = cm->in_formats;
    p_Var3 = *(FFSTypeHandle *)(CONCAT44(in_register_00000014,stage) + 0x30);
    lVar4 = 0;
    do {
      if (p_Var6->format == p_Var3) {
        iVar1 = *(int *)((long)&p_Var6->handler + 4);
        if ((iVar1 != 0) || (*(int *)&p_Var6->handler == iVar5)) {
          if ((*(int *)&p_Var6->handler == iVar5) || (iVar5 == 1 && *(int *)&p_Var6->handler == 0))
          {
            iVar2 = *(int *)(CONCAT44(in_register_00000014,stage) + 4);
            if (iVar2 == 0) {
              if (iVar1 != 7) goto LAB_0013355c;
            }
            else {
              if (*(int *)((long)&p_Var6->client_data + 4) != 0) goto LAB_0013354e;
              if ((iVar1 != 7) || (iVar2 != 0)) goto LAB_0013355c;
            }
            if ((FFSTypeHandle)p_Var6->local_prior_format != p_Var3) {
LAB_0013355c:
              return (int)lVar4;
            }
          }
        }
      }
      else if ((p_Var6->format == (FFSTypeHandle)0x0) &&
              (*(int *)((long)&p_Var6->client_data + 4) == 0)) goto LAB_0013355c;
LAB_0013354e:
      lVar4 = lVar4 + 1;
      p_Var6 = (CMincoming_format_list)&p_Var6->f2_format;
    } while (cm->in_format_count != lVar4);
  }
  return -1;
}

Assistant:

static int
check_response_cache(CManager cm, stone_type stone, action_class stage, event_item *event)
{
    int i;
    for (i=0; i < stone->response_cache_count; i++) {
//	CMtrace_out(cm, EVerbose, "Response cache %d reference_format is %p (%s), Type %s, stage is %d, requires_decoded is %d\n", i, 
//		    stone->response_cache[i].reference_format, 
//		    global_name_of_FMFormat(stone->response_cache[i].reference_format), action_str[stone->response_cache[i].action_type],
//		    stone->response_cache[i].stage, stone->response_cache[i].requires_decoded);
	if (stone->response_cache[i].reference_format == event->reference_format) {
	    /* 
	     * if the event is encoded and the action requires decoded data,
	     * this action won't do.  Scan further for decode action or 
	     * generate one with response_determination().
	     */
	    if ((stone->response_cache[i].action_type == Action_NoAction) &&
		(stage != stone->response_cache[i].stage)) {
		/* don't return NoAction unless we're querying this exact stage */
		continue;
	    }
	    if (!compatible_stages(stage, stone->response_cache[i].stage)) {
		continue;
	    }
	    if (event->event_encoded && stone->response_cache[i].requires_decoded) {
		continue;
	    }
	    if (!event->event_encoded &&
	    	(stone->response_cache[i].action_type == Action_Decode) &&
	    	(stone->response_cache[i].o.decode.target_reference_format == event->reference_format)) {
	    	continue;
	    }
	    return i;
	} else if (stone->response_cache[i].reference_format == NULL &&
                   !stone->response_cache[i].requires_decoded) {
            return i;
        }
    }
    return -1;
}